

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.cpp
# Opt level: O2

void __thiscall ot::commissioner::DtlsSession::Reset(DtlsSession *this)

{
  char cVar1;
  uchar *pw;
  uchar *puVar2;
  int aMbedtlsError;
  char *pcVar3;
  char *pcVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  allocator local_b9;
  writer write;
  string local_a8;
  string local_88;
  undefined1 local_68 [8];
  _Alloc_hider local_60;
  size_t sStack_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  code *local_40;
  
  if (this->mState - kConnecting < 3) {
    mbedtls_ssl_session_reset(&this->mSsl);
    this->mIsClientIdSet = false;
    pw = (this->mPSK).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    puVar2 = (this->mPSK).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((pw != puVar2) &&
       (aMbedtlsError = mbedtls_ssl_set_hs_ecjpake_password(&this->mSsl,pw,(long)puVar2 - (long)pw),
       aMbedtlsError != 0)) {
      std::__cxx11::string::string((string *)&local_88,"dtls",&local_b9);
      local_68._0_4_ = string_type;
      local_60._M_p = "reset EC-JPAKE password failed; {}";
      sStack_58 = 0x22;
      local_50._M_allocated_capacity = 0x100000000;
      local_40 = ::fmt::v10::detail::
                 parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
      ;
      pcVar3 = "reset EC-JPAKE password failed; {}";
      write.handler_ = (format_string_checker<char> *)local_68;
      local_50._8_8_ =
           (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_68;
      while (pcVar3 != "") {
        cVar1 = *pcVar3;
        pcVar4 = pcVar3;
        while (cVar1 != '{') {
          pcVar4 = pcVar4 + 1;
          if (pcVar4 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::writer::operator()((writer *)&write,pcVar3,"");
            goto LAB_0016d854;
          }
          cVar1 = *pcVar4;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::writer::operator()((writer *)&write,pcVar3,pcVar4);
        pcVar3 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                           (pcVar4,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_68);
      }
LAB_0016d854:
      ErrorFromMbedtlsError((Error *)local_68,aMbedtlsError);
      write.handler_ = (format_string_checker<char> *)local_60._M_p;
      fmt_00.size_ = 0xd;
      fmt_00.data_ = (char *)0x22;
      args_00.field_1.args_ = in_R9.args_;
      args_00.desc_ = (unsigned_long_long)&write;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_a8,(v10 *)"reset EC-JPAKE password failed; {}",fmt_00,args_00);
      Log(kError,&local_88,&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_88);
    }
    this->mState = kOpen;
  }
  else {
    std::__cxx11::string::string((string *)&local_88,"dtls",&local_b9);
    local_68._0_4_ = pointer_type;
    local_60._M_p = "session(={}) is in invalid state";
    sStack_58 = 0x20;
    local_50._M_allocated_capacity = 0x100000000;
    local_40 = ::fmt::v10::detail::
               parse_format_specs<void*,fmt::v10::detail::compile_parse_context<char>>;
    pcVar3 = "session(={}) is in invalid state";
    write.handler_ = (format_string_checker<char> *)local_68;
    local_50._8_8_ = (format_string_checker<char> *)local_68;
    while (pcVar3 != "") {
      cVar1 = *pcVar3;
      pcVar4 = pcVar3;
      while (cVar1 != '{') {
        pcVar4 = pcVar4 + 1;
        if (pcVar4 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*>_>::
          writer::operator()(&write,pcVar3,"");
          goto LAB_0016d7f9;
        }
        cVar1 = *pcVar4;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*>_>::
      writer::operator()(&write,pcVar3,pcVar4);
      pcVar3 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,void*>&>
                         (pcVar4,"",(format_string_checker<char> *)local_68);
    }
LAB_0016d7f9:
    fmt.size_ = 0xe;
    fmt.data_ = (char *)0x20;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_68;
    local_68 = (undefined1  [8])this;
    ::fmt::v10::vformat_abi_cxx11_(&local_a8,(v10 *)"session(={}) is in invalid state",fmt,args);
    Log(kWarn,&local_88,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
  }
  return;
}

Assistant:

void DtlsSession::Reset()
{
    if (mState != State::kConnecting && mState != State::kConnected && mState != State::kDisconnected)
    {
        LOG_WARN(LOG_REGION_DTLS, "session(={}) is in invalid state", static_cast<void *>(this));
        ExitNow();
    }

    mbedtls_ssl_session_reset(&mSsl);

    mIsClientIdSet = false;

    if (!mPSK.empty())
    {
        if (int fail = mbedtls_ssl_set_hs_ecjpake_password(&mSsl, mPSK.data(), mPSK.size()))
        {
            LOG_ERROR(LOG_REGION_DTLS, "reset EC-JPAKE password failed; {}", ErrorFromMbedtlsError(fail).GetMessage());
        }
    }

    mState = State::kOpen;

exit:
    return;
}